

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O0

Sfm_Ntk_t *
Sfm_NtkConstruct(Vec_Wec_t *vFanins,int nPis,int nPos,Vec_Str_t *vFixed,Vec_Str_t *vEmpty,
                Vec_Wrd_t *vTruths)

{
  int iVar1;
  Sfm_Ntk_t *p_00;
  Vec_Int_t *pVVar2;
  Vec_Wec_t *pVVar3;
  Sfm_Ntk_t *p;
  Vec_Wrd_t *vTruths_local;
  Vec_Str_t *vEmpty_local;
  Vec_Str_t *vFixed_local;
  int nPos_local;
  int nPis_local;
  Vec_Wec_t *vFanins_local;
  
  Sfm_CheckConsistency(vFanins,nPis,nPos,vFixed);
  p_00 = (Sfm_Ntk_t *)calloc(1,0x1c0);
  iVar1 = Vec_WecSize(vFanins);
  p_00->nObjs = iVar1;
  p_00->nPis = nPis;
  p_00->nPos = nPos;
  p_00->nNodes = (p_00->nObjs - p_00->nPis) - p_00->nPos;
  p_00->vFixed = vFixed;
  p_00->vEmpty = vEmpty;
  p_00->vTruths = vTruths;
  iVar1 = vFanins->nSize;
  (p_00->vFanins).nCap = vFanins->nCap;
  (p_00->vFanins).nSize = iVar1;
  (p_00->vFanins).pArray = vFanins->pArray;
  if (vFanins != (Vec_Wec_t *)0x0) {
    free(vFanins);
  }
  Sfm_CreateFanout(&p_00->vFanins,&p_00->vFanouts);
  Sfm_CreateLevel(&p_00->vFanins,&p_00->vLevels,vEmpty);
  Sfm_CreateLevelR(&p_00->vFanouts,&p_00->vLevelsR,vEmpty);
  Vec_IntFill(&p_00->vCounts,p_00->nObjs,0);
  Vec_IntFill(&p_00->vTravIds,p_00->nObjs,0);
  Vec_IntFill(&p_00->vTravIds2,p_00->nObjs,0);
  Vec_IntFill(&p_00->vId2Var,p_00->nObjs << 1,-1);
  Vec_IntFill(&p_00->vVar2Id,p_00->nObjs << 1,-1);
  pVVar2 = Vec_IntAlloc(0x10000);
  p_00->vCover = pVVar2;
  pVVar3 = Sfm_CreateCnf(p_00);
  p_00->vCnfs = pVVar3;
  return p_00;
}

Assistant:

Sfm_Ntk_t * Sfm_NtkConstruct( Vec_Wec_t * vFanins, int nPis, int nPos, Vec_Str_t * vFixed, Vec_Str_t * vEmpty, Vec_Wrd_t * vTruths )
{
    Sfm_Ntk_t * p;
    Sfm_CheckConsistency( vFanins, nPis, nPos, vFixed );
    p = ABC_CALLOC( Sfm_Ntk_t, 1 );
    p->nObjs    = Vec_WecSize( vFanins );
    p->nPis     = nPis;
    p->nPos     = nPos;
    p->nNodes   = p->nObjs - p->nPis - p->nPos;
    // user data
    p->vFixed   = vFixed;
    p->vEmpty   = vEmpty;
    p->vTruths  = vTruths;
    p->vFanins  = *vFanins;
    ABC_FREE( vFanins );
    // attributes
    Sfm_CreateFanout( &p->vFanins, &p->vFanouts );
    Sfm_CreateLevel( &p->vFanins, &p->vLevels, vEmpty );
    Sfm_CreateLevelR( &p->vFanouts, &p->vLevelsR, vEmpty );
    Vec_IntFill( &p->vCounts,   p->nObjs,  0 );
    Vec_IntFill( &p->vTravIds,  p->nObjs,  0 );
    Vec_IntFill( &p->vTravIds2, p->nObjs,  0 );
    Vec_IntFill( &p->vId2Var,   2*p->nObjs, -1 );
    Vec_IntFill( &p->vVar2Id,   2*p->nObjs, -1 );
    p->vCover   = Vec_IntAlloc( 1 << 16 );
    p->vCnfs    = Sfm_CreateCnf( p );
    return p;
}